

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pending_with_parameters.cpp
# Opt level: O2

void CreateSimpleTable(Connection *con)

{
  allocator local_da;
  ExprLhs<bool> local_d9;
  SourceLineInfo local_d8;
  _Head_base<0UL,_duckdb::QueryResult_*,_false> local_c8;
  _Head_base<0UL,_duckdb::QueryResult_*,_false> local_c0;
  StringRef local_b8 [2];
  AssertionHandler catchAssertionHandler;
  StringRef local_50;
  StringRef local_40;
  
  local_b8[0].m_start = "REQUIRE";
  local_b8[0].m_size = 7;
  local_d8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/test_pending_with_parameters.cpp"
  ;
  local_d8.line = 8;
  Catch::StringRef::StringRef(&local_40,"NO_FAIL((con.Query(\"CREATE TABLE a (i TINYINT)\")))");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,local_b8,&local_d8,local_40,Normal);
  std::__cxx11::string::string((string *)local_b8,"CREATE TABLE a (i TINYINT)",&local_da);
  duckdb::Connection::Query((string *)&local_d8);
  local_c0._M_head_impl = (QueryResult *)local_d8.file;
  local_d8.file = (char *)0x0;
  local_d9.m_lhs =
       duckdb::NO_FAIL((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                        *)&local_c0);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,&local_d9);
  if (local_c0._M_head_impl != (QueryResult *)0x0) {
    (**(code **)(*(long *)local_c0._M_head_impl + 8))();
  }
  local_c0._M_head_impl = (QueryResult *)0x0;
  if ((long *)local_d8.file != (long *)0x0) {
    (**(code **)(*(long *)local_d8.file + 8))();
  }
  local_d8.file = (char *)0x0;
  std::__cxx11::string::~string((string *)local_b8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b8[0].m_start = "REQUIRE";
  local_b8[0].m_size = 7;
  local_d8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/test_pending_with_parameters.cpp"
  ;
  local_d8.line = 9;
  Catch::StringRef::StringRef
            (&local_50,"NO_FAIL((con.Query(\"INSERT INTO a VALUES (11), (12), (13)\")))");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,local_b8,&local_d8,local_50,Normal);
  std::__cxx11::string::string((string *)local_b8,"INSERT INTO a VALUES (11), (12), (13)",&local_da)
  ;
  duckdb::Connection::Query((string *)&local_d8);
  local_c8._M_head_impl = (QueryResult *)local_d8.file;
  local_d8.file = (char *)0x0;
  local_d9.m_lhs =
       duckdb::NO_FAIL((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                        *)&local_c8);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,&local_d9);
  if (local_c8._M_head_impl != (QueryResult *)0x0) {
    (**(code **)(*(long *)local_c8._M_head_impl + 8))();
  }
  local_c8._M_head_impl = (QueryResult *)0x0;
  if ((long *)local_d8.file != (long *)0x0) {
    (**(code **)(*(long *)local_d8.file + 8))();
  }
  local_d8.file = (char *)0x0;
  std::__cxx11::string::~string((string *)local_b8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

static void CreateSimpleTable(Connection &con) {
	REQUIRE_NO_FAIL(con.Query("CREATE TABLE a (i TINYINT)"));
	REQUIRE_NO_FAIL(con.Query("INSERT INTO a VALUES (11), (12), (13)"));
}